

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void dynet::TensorTools::randomize_orthonormal(Tensor *val,real scale)

{
  StorageBaseType *matrix;
  runtime_error *this;
  real scale_local;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_278;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  local_258;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> svd;
  
  scale_local = scale;
  if (((val->d).nd == 2) && ((val->d).d[0] == (val->d).d[1])) {
    if (val->device->type == CPU) {
      randomize_uniform(val,-1.0,1.0);
      Tensor::operator*((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                        &local_258,val);
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_278,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_258);
      Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
                (&svd,(MatrixType *)&local_278,0x24);
      free(local_278.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data);
      matrix = (StorageBaseType *)
               Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>_>::
               matrixU(&svd.
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>
                      );
      Eigen::operator*(&local_258,&scale_local,matrix);
      Tensor::operator*(&local_278,val);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,Eigen::Matrix<float,_1,_1,0,_1,_1>const>>
                (&local_278,&local_258);
      Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&svd);
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad device type");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Attempt to set a tensor that is not a square matrix to an orthogonal matrix");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::randomize_orthonormal(Tensor& val, real scale) {
  if (val.d.nd != 2 || val.d[0] != val.d[1])
    throw std::runtime_error("Attempt to set a tensor that is not a square matrix to an orthogonal matrix");
  if (val.device->type == DeviceType::CPU) {
    randomize_uniform(val, -1.0, 1.0);
    Eigen::JacobiSVD<Eigen::MatrixXf> svd(*val, Eigen::ComputeFullU | Eigen::ComputeThinV);
    *val = scale * svd.matrixU();
#ifdef HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    DYNET_NO_CUDA_IMPL_ERROR("Orthonormal initialization");
    // TODO: The following should work, but for some reason it isn't working
    // float* t = new float[val.d.size()];
    // Tensor tt(val);
    // tt.v = t;
    // randomize_uniform(tt, -1.0, 1.0);
    // Eigen::JacobiSVD<Eigen::MatrixXf> svd(*tt, Eigen::ComputeFullU | Eigen::ComputeThinV);
    // *tt = scale * svd.matrixU();
    // CUDA_CHECK(cudaMemcpy(val.v, tt.v, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    // delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}